

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O2

MessageFederate * getMessageFed(HelicsFederate fed,HelicsError *err)

{
  element_type *peVar1;
  FedObject *pFVar2;
  MessageFederate *pMVar3;
  
  pFVar2 = helics::getFedObject(fed,err);
  if (pFVar2 != (FedObject *)0x0) {
    if (((pFVar2->type - MESSAGE < 3) &&
        (peVar1 = (pFVar2->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr, peVar1 != (element_type *)0x0)) &&
       (pMVar3 = (MessageFederate *)
                 __dynamic_cast(peVar1,&helics::Federate::typeinfo,
                                &helics::MessageFederate::typeinfo,0xffffffffffffffff),
       pMVar3 != (MessageFederate *)0x0)) {
      return pMVar3;
    }
    if (err != (HelicsError *)0x0) {
      err->error_code = -3;
      err->message = "Federate must be a message federate";
    }
  }
  return (MessageFederate *)0x0;
}

Assistant:

helics::MessageFederate* getMessageFed(HelicsFederate fed, HelicsError* err)
{
    auto* fedObj = helics::getFedObject(fed, err);
    if (fedObj == nullptr) {
        return nullptr;
    }
    if ((fedObj->type == helics::FederateType::MESSAGE) || (fedObj->type == helics::FederateType::COMBINATION) ||
        (fedObj->type == helics::FederateType::CALLBACK)) {
        auto* rval = dynamic_cast<helics::MessageFederate*>(fedObj->fedptr.get());
        if (rval != nullptr) {
            return rval;
        }
    }
    assignError(err, HELICS_ERROR_INVALID_OBJECT, notMessageFedString);
    return nullptr;
}